

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

void __thiscall cmCTestBuildCommand::BindArguments(cmCTestBuildCommand *this)

{
  cmArgumentParser<void> *this_00;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  static_string_view name_05;
  
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  this_00 = &(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>;
  name.super_string_view._M_str = "NUMBER_ERRORS";
  name.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name,&this->NumberErrors);
  name_00.super_string_view._M_str = "NUMBER_WARNINGS";
  name_00.super_string_view._M_len = 0xf;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_00,&this->NumberWarnings);
  name_01.super_string_view._M_str = "TARGET";
  name_01.super_string_view._M_len = 6;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_01,&this->Target);
  name_02.super_string_view._M_str = "CONFIGURATION";
  name_02.super_string_view._M_len = 0xd;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_02,&this->Configuration);
  name_03.super_string_view._M_str = "FLAGS";
  name_03.super_string_view._M_len = 5;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_03,&this->Flags);
  name_04.super_string_view._M_str = "PROJECT_NAME";
  name_04.super_string_view._M_len = 0xc;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_04,&this->ProjectName);
  name_05.super_string_view._M_str = "PARALLEL_LEVEL";
  name_05.super_string_view._M_len = 0xe;
  cmArgumentParser<void>::Bind<std::__cxx11::string>(this_00,name_05,&this->ParallelLevel);
  return;
}

Assistant:

void cmCTestBuildCommand::BindArguments()
{
  this->cmCTestHandlerCommand::BindArguments();
  this->Bind("NUMBER_ERRORS"_s, this->NumberErrors);
  this->Bind("NUMBER_WARNINGS"_s, this->NumberWarnings);
  this->Bind("TARGET"_s, this->Target);
  this->Bind("CONFIGURATION"_s, this->Configuration);
  this->Bind("FLAGS"_s, this->Flags);
  this->Bind("PROJECT_NAME"_s, this->ProjectName);
  this->Bind("PARALLEL_LEVEL"_s, this->ParallelLevel);
}